

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

Chain __thiscall EncodedS2LaxPolygonShape::chain(EncodedS2LaxPolygonShape *this,int i)

{
  int iVar1;
  uint _start;
  uint uVar2;
  ostream *poVar3;
  size_t sVar4;
  int start;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  EncodedS2LaxPolygonShape *pEStack_18;
  int i_local;
  EncodedS2LaxPolygonShape *this_local;
  
  local_1c = i;
  pEStack_18 = this;
  iVar1 = num_loops(this);
  if (i < iVar1) {
    iVar1 = num_loops(this);
    if (iVar1 == 1) {
      sVar4 = s2coding::EncodedS2PointVector::size(&this->vertices_);
      S2Shape::Chain::Chain((Chain *)&this_local,0,(int32)sVar4);
    }
    else {
      _start = s2coding::EncodedUintVector<unsigned_int>::operator[]
                         (&this->cumulative_vertices_,local_1c);
      uVar2 = s2coding::EncodedUintVector<unsigned_int>::operator[]
                        (&this->cumulative_vertices_,local_1c + 1);
      S2Shape::Chain::Chain((Chain *)&this_local,_start,uVar2 - _start);
    }
    return (Chain)this_local;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
             ,0x137,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_30);
  poVar3 = std::operator<<(poVar3,"Check failed: (i) < (num_loops()) ");
  S2LogMessageVoidify::operator&(&local_1d,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

S2Shape::Chain EncodedS2LaxPolygonShape::chain(int i) const {
  S2_DCHECK_LT(i, num_loops());
  if (num_loops() == 1) {
    return Chain(0, vertices_.size());
  } else {
    int start = cumulative_vertices_[i];
    return Chain(start, cumulative_vertices_[i + 1] - start);
  }
}